

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-ssl.c
# Opt level: O0

int lws_openssl_describe_cipher(lws *wsi)

{
  SSL *s_00;
  undefined4 uVar1;
  lws *plVar2;
  SSL_CIPHER *pSVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  SSL *s;
  lws *plStack_10;
  int np;
  lws *wsi_local;
  
  s._4_4_ = 0xffffffff;
  s_00 = (SSL *)(wsi->tls).ssl;
  plStack_10 = wsi;
  pSVar3 = SSL_get_current_cipher(s_00);
  SSL_CIPHER_get_bits(pSVar3,(int *)((long)&s + 4));
  plVar2 = plStack_10;
  pSVar3 = SSL_get_current_cipher(s_00);
  pcVar4 = SSL_CIPHER_get_name(pSVar3);
  pSVar3 = SSL_get_current_cipher(s_00);
  pcVar5 = SSL_CIPHER_get_name(pSVar3);
  uVar1 = s._4_4_;
  pSVar3 = SSL_get_current_cipher(s_00);
  pcVar6 = SSL_CIPHER_get_version(pSVar3);
  _lws_log(8,"%s: wsi %p: %s, %s, %d bits, %s\n","lws_openssl_describe_cipher",plVar2,pcVar4,pcVar5,
           uVar1,pcVar6);
  return 0;
}

Assistant:

int lws_openssl_describe_cipher(struct lws *wsi)
{
#if !defined(LWS_WITH_NO_LOGS)
	int np = -1;
	SSL *s = wsi->tls.ssl;

	SSL_get_cipher_bits(s, &np);
	lwsl_info("%s: wsi %p: %s, %s, %d bits, %s\n", __func__, wsi,
			SSL_get_cipher_name(s), SSL_get_cipher(s), np,
			SSL_get_cipher_version(s));
#endif

	return 0;
}